

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::DeformableConv2D_x86_avx::forward
          (DeformableConv2D_x86_avx *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int iVar2;
  Mat *pMVar3;
  size_t _elemsize;
  _func_int *p_Var4;
  Mat *this_00;
  int *piVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Option *pOVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  void *pvVar17;
  uint uVar18;
  long lVar19;
  bool bVar20;
  uint _w;
  int iVar21;
  bool bVar22;
  uint _h;
  int iVar23;
  float *pfVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  bool bVar30;
  bool bVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  ulong local_260;
  ulong local_250;
  Mat local_248;
  int local_1fc;
  Mat local_1f8;
  ulong local_1b0;
  int local_1a8;
  int local_1a4;
  int local_1a0;
  int local_19c;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_198;
  ulong local_190;
  _func_int **local_188;
  pointer local_180;
  Mat local_178;
  Mat *local_130;
  Option *local_128;
  ulong local_120;
  ulong local_118;
  void *local_110;
  long local_108;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_100;
  _func_int **local_f8;
  pointer local_f0;
  void *local_e8;
  void *local_e0;
  DeformableConv2D_x86_avx *local_d8;
  _func_int **local_d0;
  Mat local_c8;
  Mat local_78;
  
  pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_180 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  local_1b0 = (ulong)(uint)pMVar3->w;
  iVar1 = pMVar3->h;
  iVar2 = pMVar3->c;
  _elemsize = pMVar3->elemsize;
  p_Var4 = this->_vptr_DeformableConv2D_x86_avx[-3];
  uVar8 = (long)(~((*(int *)(&this->field_0xd4 + (long)p_Var4) + -1) *
                  *(int *)(&this->field_0xdc + (long)p_Var4)) + pMVar3->w +
                 *(int *)(&this->field_0xec + (long)p_Var4) +
                *(int *)(&this->field_0xf0 + (long)p_Var4)) /
          (long)*(int *)(&this->field_0xe4 + (long)p_Var4);
  local_118 = uVar8 & 0xffffffff;
  iVar14 = (~((*(int *)(&this->field_0xd8 + (long)p_Var4) + -1) *
             *(int *)(&this->field_0xe0 + (long)p_Var4)) + iVar1 +
            *(int *)(&this->field_0xf4 + (long)p_Var4) + *(int *)(&this->field_0xf8 + (long)p_Var4))
           / *(int *)(&this->field_0xe8 + (long)p_Var4);
  _w = (int)uVar8 + 1;
  local_1f8.cstep = 0;
  local_1f8.data = (void *)0x0;
  local_1f8.refcount._0_4_ = 0;
  local_1f8.refcount._4_4_ = 0;
  local_1f8.elemsize._0_4_ = 0;
  local_1f8.elemsize._4_4_ = 0;
  local_1f8.elempack = 0;
  local_1f8.allocator = (Allocator *)0x0;
  local_1f8.dims = 0;
  local_1f8.w = 0;
  local_1f8.h = 0;
  local_1f8.d = 0;
  local_1f8.c = 0;
  p_Var4 = this->_vptr_DeformableConv2D_x86_avx[-3];
  _h = iVar14 + 1;
  local_1fc = _h * _w;
  local_198 = top_blobs;
  local_100 = bottom_blobs;
  Mat::create(&local_1f8,
              local_1fc * iVar2 * *(int *)(&this->field_0xd8 + (long)p_Var4) *
              *(int *)(&this->field_0xd4 + (long)p_Var4),_elemsize,opt->blob_allocator);
  iVar21 = -100;
  if ((local_1f8.data != (void *)0x0) && ((long)local_1f8.c * local_1f8.cstep != 0)) {
    this_00 = (local_198->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(this_00,*(int *)(&this->field_0xd0 + (long)this->_vptr_DeformableConv2D_x86_avx[-3])
                ,local_1fc,_elemsize,opt->blob_allocator);
    if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
      iVar21 = iVar1 * (int)local_1b0;
      Mat::reshape(&local_78,pMVar3,iVar21 * iVar2,(Allocator *)0x0);
      local_130 = this_00;
      local_128 = opt;
      Mat::reshape(&local_c8,pMVar3 + 1,pMVar3[1].h * pMVar3[1].w * pMVar3[1].c,(Allocator *)0x0);
      if (-1 < iVar14) {
        local_180 = (pointer)((long)local_180 - (long)pMVar3);
        local_e0 = local_78.data;
        local_e8 = local_c8.data;
        iVar14 = (int)local_1b0;
        local_110 = local_1f8.data;
        local_1a8 = iVar14 + -1;
        local_190 = (ulong)_w;
        local_120 = (ulong)_h;
        local_188 = this->_vptr_DeformableConv2D_x86_avx;
        local_250 = 0;
        do {
          if (-1 < (int)local_118) {
            local_108 = local_250 * local_190;
            local_f8 = this->_vptr_DeformableConv2D_x86_avx;
            local_260 = 0;
            do {
              if (0 < *(int *)(&this->field_0xd8 + (long)local_188[-3])) {
                p_Var4 = local_188[-3];
                local_1a0 = *(int *)(&this->field_0xe8 + (long)p_Var4) * (int)local_250 -
                            *(int *)(&this->field_0xf4 + (long)p_Var4);
                iVar23 = (int)local_260;
                local_1a4 = *(int *)(&this->field_0xe4 + (long)p_Var4) * iVar23 -
                            *(int *)(&this->field_0xec + (long)p_Var4);
                pfVar24 = (float *)((long)local_1f8.data +
                                   (long)(((int)local_108 + iVar23) * iVar2 *
                                          *(int *)(&this->field_0xd8 + (long)p_Var4) *
                                         *(int *)(&this->field_0xd4 + (long)p_Var4)) * 4);
                local_d0 = this->_vptr_DeformableConv2D_x86_avx;
                iVar28 = 0;
                do {
                  iVar15 = *(int *)(&this->field_0xd4 + (long)local_f8[-3]);
                  if (0 < iVar15) {
                    local_f0 = (local_100->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                               )._M_impl.super__Vector_impl_data._M_start;
                    iVar26 = 0;
                    do {
                      iVar15 = iVar15 * iVar28 + iVar26;
                      fVar32 = 1.0;
                      if (local_180 == (pointer)0xd8) {
                        fVar32 = *(float *)((long)local_f0[2].data +
                                           local_260 * 4 +
                                           (long)local_f0[2].w * local_250 * local_f0[2].elemsize +
                                           (long)iVar15 * local_f0[2].cstep * local_f0[2].elemsize);
                      }
                      fVar9 = (float)(*(int *)(&this->field_0xe0 + (long)local_d0[-3]) * iVar28 +
                                     local_1a0) +
                              *(float *)((long)local_c8.data +
                                        (long)(int)((iVar15 * 2 * _h + (int)local_250) * _w + iVar23
                                                   ) * 4);
                      fVar10 = (float)(*(int *)(&this->field_0xdc + (long)local_d0[-3]) * iVar26 +
                                      local_1a4) +
                               *(float *)((long)local_c8.data +
                                         (long)(int)(((iVar15 * 2 + 1) * _h + (int)local_250) * _w +
                                                    iVar23) * 4);
                      if (((float)iVar14 <= fVar10 || (float)iVar1 <= fVar9) ||
                          (fVar10 <= -1.0 || fVar9 <= -1.0)) {
                        fVar33 = 0.0;
                        bVar31 = false;
                        fVar34 = 0.0;
                        fVar35 = 0.0;
                        bVar20 = false;
                        bVar22 = false;
                        bVar30 = false;
                        lVar29 = 0;
                        lVar19 = 0;
                        lVar27 = 0;
                        lVar25 = 0;
                        fVar36 = 0.0;
                      }
                      else {
                        auVar11 = vroundss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9),9);
                        uVar18 = (uint)auVar11._0_4_;
                        auVar12 = vroundss_avx(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10),9);
                        uVar16 = (uint)auVar12._0_4_;
                        fVar37 = fVar9 - auVar11._0_4_;
                        fVar35 = fVar10 - auVar12._0_4_;
                        bVar6 = (int)uVar16 < local_1a8;
                        bVar20 = -1 < (int)uVar18 && bVar6;
                        bVar7 = (int)uVar18 < iVar1 + -1;
                        bVar22 = -1 < (int)uVar16 && bVar7;
                        bVar30 = bVar7 && bVar6;
                        bVar31 = -1 < (int)(uVar18 | uVar16);
                        lVar29 = (long)(int)(iVar14 * uVar18 + uVar16);
                        if (!bVar31) {
                          lVar29 = 0;
                        }
                        lVar19 = (long)(int)(uVar16 + iVar14 * uVar18 + 1);
                        if (-1 >= (int)uVar18 || !bVar6) {
                          lVar19 = 0;
                        }
                        iVar15 = (uVar18 + 1) * iVar14;
                        lVar27 = (long)(int)(uVar16 + iVar15);
                        if (-1 >= (int)uVar16 || !bVar7) {
                          lVar27 = 0;
                        }
                        lVar25 = (long)(int)(iVar15 + uVar16 + 1);
                        if (!bVar7 || !bVar6) {
                          lVar25 = 0;
                        }
                        fVar36 = (1.0 - fVar35) * (1.0 - fVar37);
                        fVar33 = fVar35 * (1.0 - fVar37);
                        fVar34 = (1.0 - fVar35) * fVar37;
                        fVar35 = fVar35 * fVar37;
                      }
                      pvVar17 = local_78.data;
                      iVar15 = iVar2;
                      if (0 < iVar2) {
                        do {
                          fVar37 = 0.0;
                          if (((float)iVar14 > fVar10 && (float)iVar1 > fVar9) &&
                              (fVar10 > -1.0 && fVar9 > -1.0)) {
                            fVar38 = 0.0;
                            if (bVar31) {
                              fVar38 = *(float *)((long)pvVar17 + lVar29 * 4);
                            }
                            if (bVar20) {
                              fVar37 = *(float *)((long)pvVar17 + lVar19 * 4);
                            }
                            fVar40 = 0.0;
                            fVar39 = 0.0;
                            if (bVar22) {
                              fVar39 = *(float *)((long)pvVar17 + lVar27 * 4);
                            }
                            if (bVar30) {
                              fVar40 = *(float *)((long)pvVar17 + lVar25 * 4);
                            }
                            fVar37 = fVar37 * fVar33 + fVar38 * fVar36 +
                                     fVar39 * fVar34 + fVar40 * fVar35;
                          }
                          *pfVar24 = fVar37 * fVar32;
                          pfVar24 = pfVar24 + 1;
                          pvVar17 = (void *)((long)pvVar17 + (long)iVar21 * 4);
                          iVar15 = iVar15 + -1;
                        } while (iVar15 != 0);
                      }
                      iVar26 = iVar26 + 1;
                      iVar15 = *(int *)(&this->field_0xd4 + (long)local_d0[-3]);
                      local_19c = iVar28;
                    } while (iVar26 < iVar15);
                  }
                  iVar28 = iVar28 + 1;
                } while (iVar28 < *(int *)(&this->field_0xd8 + (long)local_f8[-3]));
              }
              local_260 = local_260 + 1;
            } while (local_260 != local_190);
          }
          local_250 = local_250 + 1;
          local_d8 = this;
        } while (local_250 != local_120);
      }
      Mat::reshape(&local_248,&local_1f8,
                   iVar2 * *(int *)(&this->field_0xd8 +
                                   (long)this->_vptr_DeformableConv2D_x86_avx[-3]) *
                   *(int *)(&this->field_0xd4 + (long)this->_vptr_DeformableConv2D_x86_avx[-3]),
                   local_1fc,(Allocator *)0x0);
      pOVar13 = local_128;
      pMVar3 = local_130;
      piVar5 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      piVar5 = (int *)CONCAT44(local_1f8.refcount._4_4_,local_1f8.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_1f8.allocator == (Allocator *)0x0) {
            if (local_1f8.data != (void *)0x0) {
              free(local_1f8.data);
            }
          }
          else {
            (*(local_1f8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar5 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
      local_1f8.data = local_248.data;
      local_1f8.refcount._0_4_ = local_248.refcount._0_4_;
      local_1f8.refcount._4_4_ = local_248.refcount._4_4_;
      local_1f8.elemsize._0_4_ = (undefined4)local_248.elemsize;
      local_1f8.elemsize._4_4_ = local_248.elemsize._4_4_;
      local_1f8.elempack = local_248.elempack;
      local_1f8.allocator = local_248.allocator;
      local_1f8.dims = local_248.dims;
      local_1f8.w = local_248.w;
      local_1f8.h = local_248.h;
      local_1f8.d = local_248.d;
      local_1f8.c = local_248.c;
      local_1f8.cstep = local_248.cstep;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_248.allocator == (Allocator *)0x0) {
            if (local_248.data != (void *)0x0) {
              free(local_248.data);
            }
          }
          else {
            (*(local_248.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_248.cstep = 0;
      local_248.data = (void *)0x0;
      local_248.refcount._0_4_ = 0;
      local_248.refcount._4_4_ = 0;
      local_248.elemsize._0_4_ = 0;
      local_248.elemsize._4_4_ = 0;
      local_248.elempack = 0;
      local_248.dims = 0;
      local_248.w = 0;
      local_248.h = 0;
      local_248.d = 0;
      local_248.c = 0;
      (*this->inner_product->_vptr_Layer[7])(this->inner_product,&local_1f8,pMVar3,pOVar13);
      local_248.cstep = 0;
      local_248.data = (void *)0x0;
      local_248.refcount._0_4_ = 0;
      local_248.refcount._4_4_ = 0;
      local_248.elemsize._0_4_ = 0;
      local_248.elemsize._4_4_ = 0;
      local_248.elempack = 0;
      local_248.allocator = (Allocator *)0x0;
      local_248.dims = 0;
      local_248.w = 0;
      local_248.h = 0;
      local_248.d = 0;
      local_248.c = 0;
      (*this->permute->_vptr_Layer[7])(this->permute,pMVar3,&local_248,pOVar13);
      Mat::reshape(&local_178,&local_248,_w,_h,
                   *(int *)(&this->field_0xd0 + (long)this->_vptr_DeformableConv2D_x86_avx[-3]),
                   (Allocator *)0x0);
      piVar5 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      piVar5 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_248.allocator == (Allocator *)0x0) {
            if (local_248.data != (void *)0x0) {
              free(local_248.data);
            }
          }
          else {
            (*(local_248.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar5 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
      local_248.data = local_178.data;
      local_248.refcount._0_4_ = local_178.refcount._0_4_;
      local_248.refcount._4_4_ = local_178.refcount._4_4_;
      local_248.elemsize._0_4_ = (undefined4)local_178.elemsize;
      local_248.elemsize._4_4_ = local_178.elemsize._4_4_;
      local_248.elempack = local_178.elempack;
      local_248.allocator = local_178.allocator;
      local_248.dims = local_178.dims;
      local_248.w = local_178.w;
      local_248.h = local_178.h;
      local_248.d = local_178.d;
      local_248.c = local_178.c;
      local_248.cstep = local_178.cstep;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_178.allocator == (Allocator *)0x0) {
            if (local_178.data != (void *)0x0) {
              free(local_178.data);
            }
          }
          else {
            (*(local_178.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_178.cstep = 0;
      local_178.data = (void *)0x0;
      local_178.refcount._0_4_ = 0;
      local_178.refcount._4_4_ = 0;
      local_178.elemsize._0_4_ = 0;
      local_178.elemsize._4_4_ = 0;
      local_178.elempack = 0;
      local_178.dims = 0;
      local_178.w = 0;
      local_178.h = 0;
      local_178.d = 0;
      local_178.c = 0;
      pMVar3 = (local_198->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (pMVar3 != &local_248) {
        piVar5 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        piVar5 = pMVar3->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (pMVar3->allocator == (Allocator *)0x0) {
              if (pMVar3->data != (void *)0x0) {
                free(pMVar3->data);
              }
            }
            else {
              (*pMVar3->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar3->cstep = 0;
        pMVar3->data = (void *)0x0;
        pMVar3->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar3->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar3->elemsize + 4) = 0;
        pMVar3->dims = 0;
        pMVar3->w = 0;
        pMVar3->h = 0;
        pMVar3->d = 0;
        pMVar3->c = 0;
        pMVar3->data = local_248.data;
        pMVar3->refcount = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
        pMVar3->elemsize = CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize);
        pMVar3->elempack = local_248.elempack;
        pMVar3->allocator = local_248.allocator;
        pMVar3->dims = local_248.dims;
        pMVar3->w = local_248.w;
        pMVar3->h = local_248.h;
        pMVar3->d = local_248.d;
        pMVar3->c = local_248.c;
        pMVar3->cstep = local_248.cstep;
      }
      piVar5 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_248.allocator == (Allocator *)0x0) {
            if (local_248.data != (void *)0x0) {
              free(local_248.data);
            }
          }
          else {
            (*(local_248.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_248.cstep = 0;
      local_248.data = (void *)0x0;
      local_248.refcount._0_4_ = 0;
      local_248.refcount._4_4_ = 0;
      local_248.elemsize._0_4_ = 0;
      local_248.elemsize._4_4_ = 0;
      local_248.elempack = 0;
      local_248.dims = 0;
      local_248.w = 0;
      local_248.h = 0;
      local_248.d = 0;
      local_248.c = 0;
      if (local_c8.refcount != (int *)0x0) {
        LOCK();
        *local_c8.refcount = *local_c8.refcount + -1;
        UNLOCK();
        if (*local_c8.refcount == 0) {
          if (local_c8.allocator == (Allocator *)0x0) {
            if (local_c8.data != (void *)0x0) {
              free(local_c8.data);
            }
          }
          else {
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + -1;
        UNLOCK();
        if (*local_78.refcount == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            if (local_78.data != (void *)0x0) {
              free(local_78.data);
            }
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar21 = 0;
    }
  }
  piVar5 = (int *)CONCAT44(local_1f8.refcount._4_4_,local_1f8.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_1f8.allocator == (Allocator *)0x0) {
        if (local_1f8.data != (void *)0x0) {
          free(local_1f8.data);
        }
      }
      else {
        (*(local_1f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar21;
}

Assistant:

int DeformableConv2D_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& offset = bottom_blobs[1];

    const bool has_mask = (bottom_blobs.size() == 3);

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int in_c = bottom_blob.c;
    const size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const int out_w = (w + pad_left + pad_right - kernel_extent_w) / stride_w + 1;
    const int out_h = (h + pad_top + pad_bottom - kernel_extent_h) / stride_h + 1;

    // output = im2col matmul weight_t, im2col.shape is [out_h * out_w, kernel_h * kernel_w * in_c] (in python),
    // weight_t.shape is [num_output, kernel_h * kernel_w * in_c] (in python),
    // output.shape   is [out_h * out_w, num_output] (in python).
    Mat im2col;
    im2col.create(kernel_h * kernel_w * in_c * out_h * out_w, elemsize, opt.blob_allocator);
    if (im2col.empty())
        return -100;

    Mat& output = top_blobs[0];
    output.create(num_output, out_h * out_w, elemsize, opt.blob_allocator);
    if (output.empty())
        return -100;

    Mat bottom_blob_flatten = bottom_blob.reshape(w * h * in_c);
    Mat offset_flatten = offset.reshape(offset.w * offset.h * offset.c);
    const float* data_im_ptr = bottom_blob_flatten;
    const float* data_offset_ptr = offset_flatten;
    float* im2col_ptr = im2col;

    // im2col
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int h_col = 0; h_col < out_h; h_col++)
    {
        for (int w_col = 0; w_col < out_w; w_col++)
        {
            int h_in = h_col * stride_h - pad_top;
            int w_in = w_col * stride_w - pad_left;
            float* data_col_ptr = im2col_ptr + (h_col * out_w + w_col) * kernel_h * kernel_w * in_c;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    const int data_offset_h_ptr = (((i * kernel_w + j) * 2) * out_h + h_col) * out_w + w_col;
                    const int data_offset_w_ptr = (((i * kernel_w + j) * 2 + 1) * out_h + h_col) * out_w + w_col;

                    const float offset_h = data_offset_ptr[data_offset_h_ptr];
                    const float offset_w = data_offset_ptr[data_offset_w_ptr];
                    const float mask_ = has_mask ? bottom_blobs[2].channel(i * kernel_w + j).row(h_col)[w_col] : 1.f;
                    const float h_im = h_in + i * dilation_h + offset_h;
                    const float w_im = w_in + j * dilation_w + offset_w;

                    // Bilinear
                    const bool cond = h_im > -1 && w_im > -1 && h_im < h && w_im < w;
                    float w1 = 0.f;
                    float w2 = 0.f;
                    float w3 = 0.f;
                    float w4 = 0.f;
                    bool v1_cond = false;
                    bool v2_cond = false;
                    bool v3_cond = false;
                    bool v4_cond = false;
                    int v1_pos = 0;
                    int v2_pos = 0;
                    int v3_pos = 0;
                    int v4_pos = 0;
                    if (cond)
                    {
                        int h_low = floor(h_im);
                        int w_low = floor(w_im);
                        int h_high = h_low + 1;
                        int w_high = w_low + 1;

                        float lh = h_im - h_low;
                        float lw = w_im - w_low;
                        float hh = 1 - lh;
                        float hw = 1 - lw;

                        v1_cond = (h_low >= 0 && w_low >= 0);
                        v2_cond = (h_low >= 0 && w_high <= w - 1);
                        v3_cond = (h_high <= h - 1 && w_low >= 0);
                        v4_cond = (h_high <= h - 1 && w_high <= w - 1);
                        if (v1_cond)
                            v1_pos = h_low * w + w_low;
                        if (v2_cond)
                            v2_pos = h_low * w + w_high;
                        if (v3_cond)
                            v3_pos = h_high * w + w_low;
                        if (v4_cond)
                            v4_pos = h_high * w + w_high;

                        w1 = hh * hw;
                        w2 = hh * lw;
                        w3 = lh * hw;
                        w4 = lh * lw;
                    }

                    const float* data_im_channel_ptr = data_im_ptr;
                    for (int c_im = 0; c_im < in_c; c_im++)
                    {
                        float val = 0.f;
                        if (cond)
                        {
                            float v1 = v1_cond ? data_im_channel_ptr[v1_pos] : 0.f;
                            float v2 = v2_cond ? data_im_channel_ptr[v2_pos] : 0.f;
                            float v3 = v3_cond ? data_im_channel_ptr[v3_pos] : 0.f;
                            float v4 = v4_cond ? data_im_channel_ptr[v4_pos] : 0.f;
                            val = w1 * v1 + w2 * v2 + w3 * v3 + w4 * v4;
                        }
                        *data_col_ptr = val * mask_;
                        data_col_ptr += 1;
                        data_im_channel_ptr += h * w;
                    }
                }
            }
        }
    }
    im2col = im2col.reshape(kernel_h * kernel_w * in_c, out_h * out_w);
    // call InnerProduct
    inner_product->forward(im2col, output, opt);
    ncnn::Mat output_t;
    // call Permute
    permute->forward(output, output_t, opt);
    output_t = output_t.reshape(out_w, out_h, num_output);
    top_blobs[0] = output_t;
    return 0;
}